

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall
tinyusdz::GeomPrimvar::flatten_with_indices
          (GeomPrimvar *this,double t,Value *dest,TimeSampleInterpolationType tinterp,string *err)

{
  bool bVar1;
  uint32_t uVar2;
  PrimVar *this_00;
  AttrMeta *pAVar3;
  value_type *pvVar4;
  error_type *peVar5;
  long lVar6;
  uint *args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1238;
  string local_1218;
  allocator local_11f1;
  string local_11f0 [32];
  string local_11d0;
  undefined1 local_11b0 [8];
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_46;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> expanded_val_46;
  vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> value_46;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_45;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> expanded_val_45;
  vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> value_45;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_44;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> expanded_val_44;
  vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> value_44;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_43;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> expanded_val_43;
  vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> value_43;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_42;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> expanded_val_42;
  vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> value_42;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_41;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> expanded_val_41;
  vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> value_41;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_40;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> expanded_val_40;
  vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> value_40;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_39;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> expanded_val_39;
  vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> value_39;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_38;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> expanded_val_38;
  vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> value_38;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_37;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> expanded_val_37;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> value_37;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_36;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> expanded_val_36;
  vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> value_36;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_35;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> expanded_val_35;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> value_35;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_34;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> expanded_val_34;
  vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> value_34;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_33;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> expanded_val_33;
  vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> value_33;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_32;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> expanded_val_32;
  vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> value_32;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_31;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> expanded_val_31;
  vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> value_31;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_30;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> expanded_val_30;
  vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> value_30;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_29;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> expanded_val_29;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> value_29;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_28;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> expanded_val_28;
  vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> value_28;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_27;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> expanded_val_27;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> value_27;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_26;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> expanded_val_26;
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> value_26;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_25;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> expanded_val_25;
  vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> value_25;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_24;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> expanded_val_24;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> value_24;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_23;
  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> expanded_val_23;
  vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> value_23;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_22;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> expanded_val_22;
  vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> value_22;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_21;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> expanded_val_21;
  vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> value_21;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_20;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> expanded_val_20;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> value_20;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_19;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> expanded_val_19;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> value_19;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_18;
  vector<double,_std::allocator<double>_> expanded_val_18;
  vector<double,_std::allocator<double>_> value_18;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_17;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> expanded_val_17;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> value_17;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_16;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> expanded_val_16;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> value_16;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_15;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> expanded_val_15;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> value_15;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_14;
  vector<float,_std::allocator<float>_> expanded_val_14;
  vector<float,_std::allocator<float>_> value_14;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_13;
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
  expanded_val_13;
  vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_> value_13;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_12;
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
  expanded_val_12;
  vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_> value_12;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_11;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
  expanded_val_11;
  vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_> value_11;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> expanded_val_10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> value_10;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_9;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> expanded_val_9;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> value_9;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_8;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> expanded_val_8;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> value_8;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_7;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> expanded_val_7;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> value_7;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_6;
  vector<int,_std::allocator<int>_> expanded_val_6;
  vector<int,_std::allocator<int>_> value_6;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_5;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  expanded_val_5;
  vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
  value_5;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_4;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  expanded_val_4;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  value_4;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_3;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  expanded_val_3;
  vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
  value_3;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_2;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> expanded_val_2;
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> value_2;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded_val_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_1;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  vector<bool,_std::allocator<bool>_> expanded_val;
  vector<bool,_std::allocator<bool>_> value;
  undefined1 local_160 [8];
  vector<int,_std::allocator<int>_> indices;
  undefined1 local_140 [4];
  uint32_t elementSize;
  string err_msg;
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  Value v;
  Value val;
  allocator local_81;
  string local_80 [32];
  string local_60;
  byte local_39;
  string *psStack_38;
  bool processed;
  string *err_local;
  Value *pVStack_28;
  TimeSampleInterpolationType tinterp_local;
  Value *dest_local;
  double t_local;
  GeomPrimvar *this_local;
  
  psStack_38 = err;
  err_local._4_4_ = tinterp;
  pVStack_28 = dest;
  dest_local = (Value *)t;
  t_local = (double)this;
  if (dest == (Value *)0x0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator+=((string *)err,"Output value is nullptr.");
    }
    this_local._7_1_ = 0;
    goto LAB_0025a666;
  }
  local_39 = 0;
  bVar1 = Attribute::has_value(&this->_attr);
  if ((bVar1) || (bVar1 = Attribute::has_timesamples(&this->_attr), bVar1)) {
    uVar2 = Attribute::type_id(&this->_attr);
    bVar1 = IsSupportedGeomPrimvarType(uVar2);
    if (!bVar1) {
      if (psStack_38 != (string *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_80,"Unsupported type for GeomPrimvar. type = `{}`",&local_81);
        Attribute::type_name_abi_cxx11_((string *)&val.v_.vtable,&this->_attr);
        fmt::format<std::__cxx11::string>(&local_60,(fmt *)local_80,(string *)&val.v_.vtable,err);
        std::__cxx11::string::operator+=((string *)psStack_38,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&val.v_.vtable);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
      this_local._7_1_ = 0;
      goto LAB_0025a666;
    }
    tinyusdz::value::Value::Value((Value *)&v.v_.vtable);
    uVar2 = Attribute::type_id(&this->_attr);
    if ((uVar2 & 0x100000) == 0) {
      tinyusdz::value::Value::Value((Value *)local_d8);
      this_00 = Attribute::get_var(&this->_attr);
      bVar1 = primvar::PrimVar::get_interpolated_value
                        (this_00,(double)dest_local,err_local._4_4_,(Value *)local_d8);
      if (bVar1) {
        tinyusdz::value::Value::operator=(pVStack_28,(Value *)local_d8);
        err_msg.field_2._8_4_ = 0;
      }
      else {
        if (psStack_38 != (string *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_118,"Failed to evaluate Attribute value.",
                     (allocator *)(err_msg.field_2._M_local_buf + 0xf));
          fmt::format(&local_f8,&local_118);
          std::__cxx11::string::operator+=((string *)psStack_38,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator((allocator<char> *)(err_msg.field_2._M_local_buf + 0xf));
        }
        this_local._7_1_ = 0;
        err_msg.field_2._8_4_ = 1;
      }
      tinyusdz::value::Value::~Value((Value *)local_d8);
      if (err_msg.field_2._8_4_ == 0) goto LAB_0025a638;
    }
    else {
      std::__cxx11::string::string((string *)local_140);
      pAVar3 = Attribute::metas(&this->_attr);
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           nonstd::optional_lite::optional<unsigned_int>::value_or<int>
                     (&pAVar3->elementSize,
                      (int *)&indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_160)
      ;
      tinyusdz::value::TimeCode::TimeCode
                ((TimeCode *)
                 &value.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_end_of_storage,(double)dest_local);
      bVar1 = tinyusdz::value::TimeCode::is_default
                        ((TimeCode *)
                         &value.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
      if (bVar1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((vector<int,_std::allocator<int>_> *)local_160,&this->_indices);
      }
      else {
        TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::
        get<std::vector<int,_std::allocator<int>_>,_nullptr>
                  (&this->_ts_indices,(vector<int,_std::allocator<int>_> *)local_160,
                   (double)dest_local,err_local._4_4_);
      }
      uVar2 = Attribute::type_id(&this->_attr);
      args = &switchD_00257819::switchdataD_003ab8a4;
      switch(uVar2 - 0x100007) {
      case 0:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&expanded_val_1.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ret_1.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&expanded_val_1.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::__cxx11::string>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_2.
                         super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_1.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_2.
                              super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_2.
                                 super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&ret_1.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_2.
                                 super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_2.
                          super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ret_1.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&expanded_val_1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      default:
        local_39 = 0;
        break;
      case 2:
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)
                   &expanded_val.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)
                   &ret.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::get_value<std::vector<bool,std::allocator<bool>>>
                          (&this->_attr,(double)dest_local,
                           (vector<bool,_std::allocator<bool>_> *)
                           &expanded_val.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<bool>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<bool,_std::allocator<bool>_> *)
                     &expanded_val.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<bool,_std::allocator<bool>_> *)
                     &ret.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<bool,_std::allocator<bool>_> *)
                         &ret.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_1.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_1.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)
                   &ret.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)
                   &expanded_val.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
        break;
      case 7:
        std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                  ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &expanded_val_2.
                    super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                  ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &ret_2.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                           &expanded_val_2.
                            super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::half>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_3.
                         super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     &expanded_val_2.
                      super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     &ret_2.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_3.
                              super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_3.
                                 super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                         &ret_2.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_3.
                                 super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_3.
                          super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                  ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &ret_2.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                  ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &expanded_val_2.
                    super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 8:
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &expanded_val_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &ret_6.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::get_value<std::vector<int,std::allocator<int>>>
                          (&this->_attr,(double)dest_local,
                           (vector<int,_std::allocator<int>_> *)
                           &expanded_val_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<int>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_7.
                         super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<int,_std::allocator<int>_> *)
                     &expanded_val_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_6.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_7.
                              super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_7.
                                 super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<int,_std::allocator<int>_> *)
                         &ret_6.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_7.
                                 super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_7.
                          super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &ret_6.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   &expanded_val_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        break;
      case 10:
        std::
        vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)&expanded_val_3.
                     super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)&ret_3.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                            *)&expanded_val_3.
                               super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<tinyusdz::value::half,2ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_4.
                         super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_3.
                      super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      *)(ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_3.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      *)in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_4.
                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_4.
                                 super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                          *)&ret_3.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_4.
                                 super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_4.
                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::
        vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                   *)&ret_3.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
        std::
        vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                   *)&expanded_val_3.
                      super__Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0xb:
        std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&expanded_val_4.
                     super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&ret_4.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            *)&expanded_val_4.
                               super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<tinyusdz::value::half,3ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_5.
                         super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_4.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)(ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_4.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_5.
                              super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_5.
                                 super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          *)&ret_4.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_5.
                                 super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_5.
                          super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)&ret_4.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
        std::
        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                   *)&expanded_val_4.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0xc:
        std::
        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)&expanded_val_5.
                     super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)&ret_5.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                            *)&expanded_val_5.
                               super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<tinyusdz::value::half,4ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_5.
                      super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      *)(ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_5.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      *)in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                          *)&ret_5.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::
        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                   *)&ret_5.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
        std::
        vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
        ::~vector((vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                   *)&expanded_val_5.
                      super__Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0xd:
        std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
                  ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                   &expanded_val_7.
                    super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
                  ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                   &ret_7.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                           &expanded_val_7.
                            super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<int,2ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_8.
                         super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_7.
                      super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                     (ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_7.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_8.
                              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_8.
                                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                         &ret_7.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_8.
                                 super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_8.
                          super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~vector
                  ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                   &ret_7.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~vector
                  ((vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                   &expanded_val_7.
                    super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0xe:
        std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
                  ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                   &expanded_val_8.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
                  ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                   &ret_8.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                           &expanded_val_8.
                            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<int,3ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_9.
                         super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_8.
                      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                     (ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_8.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_9.
                              super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_9.
                                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                         &ret_8.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_9.
                                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_9.
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
                  ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                   &ret_8.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~vector
                  ((vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                   &expanded_val_8.
                    super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0xf:
        std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
                  ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                   &expanded_val_9.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
                  ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                   &ret_9.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                           &expanded_val_9.
                            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<int,4ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_9.
                      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                     (ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_9.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_10.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_10.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                         &ret_9.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_10.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector
                  ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                   &ret_9.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector
                  ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                   &expanded_val_9.
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x14:
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &expanded_val_10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &ret_10.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::get_value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                          (&this->_attr,(double)dest_local,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &expanded_val_10.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<unsigned_int>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_11.
                         super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &expanded_val_10.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &ret_10.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_11.
                              super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_11.
                                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &ret_10.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_11.
                                 super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_11.
                          super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &ret_10.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &expanded_val_10.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x1e:
        std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ::vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)&expanded_val_11.
                     super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ::vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)&ret_11.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                            *)&expanded_val_11.
                               super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,2ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_12.
                         super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_11.
                      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      *)(ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_11.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      *)in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_12.
                              super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_12.
                                 super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                          *)&ret_11.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_12.
                                 super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_12.
                          super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ::~vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   *)&ret_11.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
        std::vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
        ::~vector((vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   *)&expanded_val_11.
                      super__Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x1f:
        std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
        ::vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)&expanded_val_12.
                     super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
        ::vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)&ret_12.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                            *)&expanded_val_12.
                               super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,3ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_13.
                         super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_12.
                      super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      *)(ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_12.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      *)in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_13.
                              super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_13.
                                 super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                          *)&ret_12.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_13.
                                 super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_13.
                          super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
        ::~vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                   *)&ret_12.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
        std::vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
        ::~vector((vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                   *)&expanded_val_12.
                      super__Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x20:
        std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
        ::vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)&expanded_val_13.
                     super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
        ::vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)&ret_13.contained.
                     super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                            *)&expanded_val_13.
                               super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,4ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_14.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_13.
                      super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                      *)(ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_13.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                      *)in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_14.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_14.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                          *)&ret_13.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_14.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_14.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
        ::~vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                   *)&ret_13.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
        std::vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
        ::~vector((vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                   *)&expanded_val_13.
                      super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x21:
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   &expanded_val_14.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   &ret_14.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::get_value<std::vector<float,std::allocator<float>>>
                          (&this->_attr,(double)dest_local,
                           (vector<float,_std::allocator<float>_> *)
                           &expanded_val_14.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<float>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_15.
                         super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<float,_std::allocator<float>_> *)
                     &expanded_val_14.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<float,_std::allocator<float>_> *)
                     &ret_14.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_15.
                              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_15.
                                 super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<float,_std::allocator<float>_> *)
                         &ret_14.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_15.
                                 super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_15.
                          super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)
                   &ret_14.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)
                   &expanded_val_14.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x22:
        std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &expanded_val_15.
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &ret_15.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            *)&expanded_val_15.
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<float,2ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_16.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_15.
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     (ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_15.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_16.
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_16.
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *
                         )&ret_15.contained.
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_16.
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_16.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &ret_15.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
                  ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   &expanded_val_15.
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x23:
        std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &expanded_val_16.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &ret_16.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            *)&expanded_val_16.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<float,3ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_17.
                         super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_16.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     (ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_16.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_17.
                              super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_17.
                                 super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *
                         )&ret_16.contained.
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_17.
                                 super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_17.
                          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &ret_16.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~vector
                  ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   &expanded_val_16.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x24:
        std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
                  ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &expanded_val_17.
                    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
                  ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &ret_17.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                            *)&expanded_val_17.
                               super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<float,4ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_17.
                      super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     (ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_17.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_18.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *
                         )&ret_17.contained.
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_18.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::~vector
                  ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &ret_17.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::~vector
                  ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   &expanded_val_17.
                    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x25:
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   &expanded_val_18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   &ret_18.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::get_value<std::vector<double,std::allocator<double>>>
                          (&this->_attr,(double)dest_local,
                           (vector<double,_std::allocator<double>_> *)
                           &expanded_val_18.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<double>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_19.
                         super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<double,_std::allocator<double>_> *)
                     &expanded_val_18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<double,_std::allocator<double>_> *)
                     &ret_18.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_19.
                              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_19.
                                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<double,_std::allocator<double>_> *)
                         &ret_18.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_19.
                                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_19.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   &ret_18.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   &expanded_val_18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x26:
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &expanded_val_19.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &ret_19.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                            *)&expanded_val_19.
                               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<double,2ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_20.
                         super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_19.
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     (ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_19.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_20.
                              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_20.
                                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          *)&ret_19.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_20.
                                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_20.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &ret_19.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
                  ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   &expanded_val_19.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x27:
        std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &expanded_val_20.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &ret_20.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                            *)&expanded_val_20.
                               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<double,3ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_21.
                         super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_20.
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     (ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_20.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_21.
                              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_21.
                                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          *)&ret_20.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_21.
                                 super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_21.
                          super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &ret_20.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
                  ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   &expanded_val_20.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x28:
        std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &expanded_val_21.
                    super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::vector
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &ret_21.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                          (&this->_attr,(double)dest_local,
                           (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                            *)&expanded_val_21.
                               super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          (anonymous_namespace)::ExpandWithIndices<std::array<double,4ul>>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_22.
                         super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (_anonymous_namespace_ *)
                     &expanded_val_21.
                      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     (ulong)indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,(uint32_t)args,
                     (vector<int,_std::allocator<int>_> *)
                     &ret_21.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value,
                     (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     in_R9);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_22.
                              super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_22.
                                 super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                          *)&ret_21.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_22.
                                 super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_22.
                          super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::~vector
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &ret_21.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::~vector
                  ((vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   &expanded_val_21.
                    super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x29:
        std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::vector
                  ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &expanded_val_25.
                    super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::vector
                  ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &ret_25.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                            *)&expanded_val_25.
                               super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::quath>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_26.
                         super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                     &expanded_val_25.
                      super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                     &ret_25.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_26.
                              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_26.
                                 super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                         &ret_25.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_26.
                                 super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_26.
                          super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::~vector
                  ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &ret_25.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::~vector
                  ((vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   &expanded_val_25.
                    super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x2a:
        std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
                  ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &expanded_val_26.
                    super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
                  ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &ret_26.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            *)&expanded_val_26.
                               super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::quatf>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_27.
                         super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                     &expanded_val_26.
                      super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                     &ret_26.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_27.
                              super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_27.
                                 super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         &ret_26.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_27.
                                 super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_27.
                          super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::~vector
                  ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &ret_26.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::~vector
                  ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   &expanded_val_26.
                    super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x2b:
        std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::vector
                  ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   &expanded_val_27.
                    super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::vector
                  ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   &ret_27.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                            *)&expanded_val_27.
                               super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::quatd>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_28.
                         super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                     &expanded_val_27.
                      super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                     &ret_27.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_28.
                              super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_28.
                                 super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                         &ret_27.contained.
                          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_28.
                                 super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_28.
                          super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::~vector
                  ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   &ret_27.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::~vector
                  ((vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   &expanded_val_27.
                    super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x2f:
        std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::vector
                  ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                   &expanded_val_22.
                    super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::vector
                  ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                   &ret_22.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                            *)&expanded_val_22.
                               super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix2d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_23.
                         super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                      *)&expanded_val_22.
                         super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                      *)&ret_22.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_23.
                              super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_23.
                                 super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                          *)&ret_22.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_23.
                                 super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_23.
                          super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::~vector
                  ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                   &ret_22.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::~vector
                  ((vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                   &expanded_val_22.
                    super__Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x30:
        std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::vector
                  ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                   &expanded_val_23.
                    super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::vector
                  ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                   &ret_23.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                            *)&expanded_val_23.
                               super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix3d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_24.
                         super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                      *)&expanded_val_23.
                         super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                      *)&ret_23.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_24.
                              super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_24.
                                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                          *)&ret_23.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_24.
                                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_24.
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::~vector
                  ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                   &ret_23.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::~vector
                  ((vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                   &expanded_val_23.
                    super__Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x31:
        std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                  ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   &expanded_val_24.
                    super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                  ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   &ret_24.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            *)&expanded_val_24.
                               super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix4d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_25.
                         super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      *)&expanded_val_24.
                         super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      *)&ret_24.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_25.
                              super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_25.
                                 super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          *)&ret_24.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_25.
                                 super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_25.
                          super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::~vector
                  ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   &ret_24.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::~vector
                  ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   &expanded_val_24.
                    super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x33:
        std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::vector
                  ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &expanded_val_37.
                    super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::vector
                  ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &ret_37.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                            *)&expanded_val_37.
                               super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::color3f>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_38.
                         super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                     &expanded_val_37.
                      super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                     &ret_37.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_38.
                              super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_38.
                                 super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                          *)&ret_37.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_38.
                                 super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_38.
                          super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::~vector
                  ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &ret_37.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::~vector
                  ((vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   &expanded_val_37.
                    super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x34:
        std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::vector
                  ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &expanded_val_38.
                    super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::vector
                  ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &ret_38.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                            *)&expanded_val_38.
                               super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::color3d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_39.
                         super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                     &expanded_val_38.
                      super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                     &ret_38.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_39.
                              super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_39.
                                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                          *)&ret_38.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_39.
                                 super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_39.
                          super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::~vector
                  ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &ret_38.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::~vector
                  ((vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   &expanded_val_38.
                    super__Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x36:
        std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::vector
                  ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &expanded_val_39.
                    super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::vector
                  ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &ret_39.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                            *)&expanded_val_39.
                               super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::color4f>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_40.
                         super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     &expanded_val_39.
                      super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     &ret_39.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_40.
                              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_40.
                                 super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                          *)&ret_39.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_40.
                                 super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_40.
                          super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::~vector
                  ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &ret_39.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::~vector
                  ((vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   &expanded_val_39.
                    super__Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x37:
        std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::vector
                  ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &expanded_val_40.
                    super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::vector
                  ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &ret_40.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                            *)&expanded_val_40.
                               super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::color4d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_41.
                         super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     &expanded_val_40.
                      super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     &ret_40.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_41.
                              super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_41.
                                 super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                          *)&ret_40.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_41.
                                 super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_41.
                          super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::~vector
                  ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &ret_40.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::~vector
                  ((vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   &expanded_val_40.
                    super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x38:
        std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::vector
                  ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &expanded_val_34.
                    super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::vector
                  ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &ret_34.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                            *)&expanded_val_34.
                               super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3h>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_35.
                         super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                     &expanded_val_34.
                      super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                     &ret_34.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_35.
                              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_35.
                                 super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                          *)&ret_34.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_35.
                                 super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_35.
                          super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::~vector
                  ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &ret_34.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::~vector
                  ((vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   &expanded_val_34.
                    super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x39:
        std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
                  ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &expanded_val_35.
                    super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
                  ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &ret_35.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                            *)&expanded_val_35.
                               super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3f>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_36.
                         super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                     &expanded_val_35.
                      super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                     &ret_35.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_36.
                              super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_36.
                                 super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                          *)&ret_35.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_36.
                                 super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_36.
                          super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::~vector
                  ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &ret_35.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::~vector
                  ((vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   &expanded_val_35.
                    super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x3a:
        std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::vector
                  ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &expanded_val_36.
                    super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::vector
                  ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &ret_36.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                            *)&expanded_val_36.
                               super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_37.
                         super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                     &expanded_val_36.
                      super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                     &ret_36.contained.
                      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_37.
                              super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_37.
                                 super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                          *)&ret_36.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_37.
                                 super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_37.
                          super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::~vector
                  ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &ret_36.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::~vector
                  ((vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   &expanded_val_36.
                    super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x3b:
        std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::vector
                  ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &expanded_val_28.
                    super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::vector
                  ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &ret_28.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                            *)&expanded_val_28.
                               super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3h>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_29.
                         super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      *)&expanded_val_28.
                         super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      *)&ret_28.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_29.
                              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_29.
                                 super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                          *)&ret_28.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_29.
                                 super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_29.
                          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::~vector
                  ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &ret_28.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::~vector
                  ((vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   &expanded_val_28.
                    super__Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x3c:
        std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
                  ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &expanded_val_29.
                    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
                  ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &ret_29.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            *)&expanded_val_29.
                               super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3f>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_30.
                         super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)&expanded_val_29.
                         super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)&ret_29.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_30.
                              super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_30.
                                 super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          *)&ret_29.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_30.
                                 super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_30.
                          super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::~vector
                  ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &ret_29.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::~vector
                  ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &expanded_val_29.
                    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x3d:
        std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::vector
                  ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &expanded_val_30.
                    super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::vector
                  ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &ret_30.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                            *)&expanded_val_30.
                               super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_31.
                         super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                      *)&expanded_val_30.
                         super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                      *)&ret_30.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_31.
                              super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_31.
                                 super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                          *)&ret_30.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_31.
                                 super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_31.
                          super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::~vector
                  ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &ret_30.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::~vector
                  ((vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   &expanded_val_30.
                    super__Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x3e:
        std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::vector
                  ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &expanded_val_31.
                    super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::vector
                  ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &ret_31.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                            *)&expanded_val_31.
                               super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::vector3h>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_32.
                         super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                      *)&expanded_val_31.
                         super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                      *)&ret_31.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_32.
                              super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_32.
                                 super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                          *)&ret_31.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_32.
                                 super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_32.
                          super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::~vector
                  ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &ret_31.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::~vector
                  ((vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   &expanded_val_31.
                    super__Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x3f:
        std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::vector
                  ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &expanded_val_32.
                    super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::vector
                  ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &ret_32.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                            *)&expanded_val_32.
                               super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::vector3f>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_33.
                         super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      *)&expanded_val_32.
                         super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      *)&ret_32.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_33.
                              super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_33.
                                 super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                          *)&ret_32.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_33.
                                 super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_33.
                          super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::~vector
                  ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &ret_32.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::~vector
                  ((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &expanded_val_32.
                    super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x40:
        std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::vector
                  ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &expanded_val_33.
                    super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::vector
                  ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &ret_33.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                            *)&expanded_val_33.
                               super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::vector3d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_34.
                         super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                      *)&expanded_val_33.
                         super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                      *)&ret_33.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_34.
                              super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_34.
                                 super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                          *)&ret_33.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_34.
                                 super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_34.
                          super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::~vector
                  ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &ret_33.contained.
                    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
        std::vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::~vector
                  ((vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   &expanded_val_33.
                    super__Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x42:
        std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *)
               &expanded_val_41.
                super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *)
               &ret_41.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                            *)&expanded_val_41.
                               super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord2h>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_42.
                         super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                      *)&expanded_val_41.
                         super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                      *)&ret_41.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_42.
                              super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_42.
                                 super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                          *)&ret_41.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_42.
                                 super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_42.
                          super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        ~vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *
                )&ret_41.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value);
        std::vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
        ~vector((vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_> *
                )&expanded_val_41.
                  super__Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x43:
        std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
               &expanded_val_42.
                super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
               &ret_42.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                            *)&expanded_val_42.
                               super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord2f>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_43.
                         super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                      *)&expanded_val_42.
                         super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                      *)&ret_42.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_43.
                              super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_43.
                                 super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                          *)&ret_42.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_43.
                                 super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_43.
                          super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        ~vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *
                )&ret_42.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value);
        std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        ~vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *
                )&expanded_val_42.
                  super__Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x44:
        std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)
               &expanded_val_43.
                super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *)
               &ret_43.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                            *)&expanded_val_43.
                               super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord2d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_44.
                         super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                      *)&expanded_val_43.
                         super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                      *)&ret_43.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_44.
                              super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_44.
                                 super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                          *)&ret_43.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_44.
                                 super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_44.
                          super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        ~vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *
                )&ret_43.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value);
        std::vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
        ~vector((vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_> *
                )&expanded_val_43.
                  super__Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x45:
        std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *)
               &expanded_val_44.
                super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *)
               &ret_44.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                            *)&expanded_val_44.
                               super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3h>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_45.
                         super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      *)&expanded_val_44.
                         super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      *)&ret_44.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_45.
                              super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_45.
                                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                          *)&ret_44.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_45.
                                 super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_45.
                          super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        ~vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *
                )&ret_44.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value);
        std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        ~vector((vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *
                )&expanded_val_44.
                  super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x46:
        std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
               &expanded_val_45.
                super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)
               &ret_45.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                            *)&expanded_val_45.
                               super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3f>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&value_46.
                         super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      *)&expanded_val_45.
                         super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      *)&ret_45.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool
                            ((expected *)
                             &value_46.
                              super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_46.
                                 super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                          *)&ret_45.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&value_46.
                                 super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&value_46.
                          super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        ~vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *
                )&ret_45.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value);
        std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
        ~vector((vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *
                )&expanded_val_45.
                  super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        break;
      case 0x47:
        std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *)
               &expanded_val_46.
                super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *)
               &ret_46.contained.
                super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
        bVar1 = Attribute::
                get_value<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                          (&this->_attr,(double)dest_local,
                           (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                            *)&expanded_val_46.
                               super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,err_local._4_4_);
        if (bVar1) {
          args = (uint *)local_160;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3d>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_11b0,
                     (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                      *)&expanded_val_46.
                         super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     (vector<int,_std::allocator<int>_> *)args,
                     (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                      *)&ret_46.contained.
                         super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .m_has_value);
          bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_11b0);
          if (bVar1) {
            pvVar4 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_11b0);
            local_39 = *pvVar4 & 1;
            if (local_39 != 0) {
              tinyusdz::value::Value::operator=
                        ((Value *)&v.v_.vtable,
                         (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                          *)&ret_46.contained.
                             super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             .m_has_value);
            }
          }
          else {
            peVar5 = nonstd::expected_lite::
                     expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_11b0);
            std::__cxx11::string::operator=((string *)local_140,(string *)peVar5);
          }
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_11b0);
        }
        err_msg.field_2._8_4_ = 2;
        std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        ~vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *
                )&ret_46.contained.
                  super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .m_has_value);
        std::vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
        ~vector((vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_> *
                )&expanded_val_46.
                  super__Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if ((local_39 & 1) == 0) {
        if (psStack_38 != (string *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_11f0,"[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
                     &local_11f1);
          Attribute::type_name_abi_cxx11_(&local_1218,&this->_attr);
          fmt::format<std::__cxx11::string>
                    (&local_11d0,(fmt *)local_11f0,&local_1218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
          std::__cxx11::string::operator+=((string *)psStack_38,(string *)&local_11d0);
          std::__cxx11::string::~string((string *)&local_11d0);
          std::__cxx11::string::~string((string *)&local_1218);
          std::__cxx11::string::~string(local_11f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_11f1);
          lVar6 = std::__cxx11::string::size();
          if (lVar6 != 0) {
            std::operator+(&local_1238,"\n",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140);
            std::__cxx11::string::operator+=((string *)psStack_38,(string *)&local_1238);
            std::__cxx11::string::~string((string *)&local_1238);
          }
        }
      }
      else {
        tinyusdz::value::Value::operator=(pVStack_28,(Value *)&v.v_.vtable);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_160);
      std::__cxx11::string::~string((string *)local_140);
LAB_0025a638:
      err_msg.field_2._8_4_ = 0;
    }
    tinyusdz::value::Value::~Value((Value *)&v.v_.vtable);
    if (err_msg.field_2._8_4_ != 0) goto LAB_0025a666;
  }
  this_local._7_1_ = local_39 & 1;
LAB_0025a666:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GeomPrimvar::flatten_with_indices(const double t, value::Value *dest, const value::TimeSampleInterpolationType tinterp, std::string *err) const {

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  bool processed = false;

  if (_attr.has_value() || _attr.has_timesamples()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    value::Value val;

    if (!(_attr.type_id() & value::TYPE_ID_1D_ARRAY_BIT)) {

      // evaluate value at specified time and return it for scalar type.
      value::Value v;
      if (!_attr.get_var().get_interpolated_value(t, tinterp, &v)) {
        if (err) {
          (*err) += fmt::format("Failed to evaluate Attribute value.");
        }
        return false;
      }
      (*dest) = v;
    } else {
      std::string err_msg;

      uint32_t elementSize = _attr.metas().elementSize.value_or(1);

      std::vector<int32_t> indices;
      // Get indices at specified time
      if (value::TimeCode(t).is_default()) {
        indices = _indices;
      } else {
        _ts_indices.get(&indices, t, tinterp);
      }

#define APPLY_FUN(__ty)                                                  \
  case value::TypeTraits<__ty>::type_id() | value::TYPE_ID_1D_ARRAY_BIT: { \
    std::vector<__ty> value; \
    std::vector<__ty> expanded_val;                                      \
    if (_attr.get_value(t, &value, tinterp)) {                \
      auto ret = ExpandWithIndices(value, elementSize, indices, &expanded_val); \
      if (ret) {                                                         \
        processed = ret.value();                                         \
        if (processed) {                                                 \
          val = expanded_val;                                            \
        }                                                                \
      } else {                                                           \
        err_msg = ret.error();                                           \
      }                                                                  \
    }                                                                    \
    break;                                                               \
  }

      switch (_attr.type_id()) {
        APPLY_GEOMPRIVAR_TYPE(APPLY_FUN)
        default: {
          processed = false;
        }
      }

#undef APPLY_FUN

      if (processed) {
        (*dest) = std::move(val);
      } else {
        if (err) {
          (*err) += fmt::format(
              "[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
              _attr.type_name());
          if (err_msg.size()) {
            (*err) += "\n" + err_msg;
          }
        }
      }
    }
  }

  return processed;
}